

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_BakeFontBitmap
              (uchar *data,int offset,float pixel_height,uchar *pixels,int pw,int ph,int first_char,
              int num_chars,stbtt_bakedchar *chardata)

{
  int iVar1;
  int glyph_index;
  int out_h;
  int out_w;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  undefined1 local_c0 [8];
  stbtt_fontinfo f;
  int lsb;
  int local_5c;
  int local_58;
  int advance;
  int x1;
  int y1;
  int local_48;
  int local_44;
  int local_40;
  int x0;
  int y0;
  float local_34;
  
  local_c0 = (undefined1  [8])0x0;
  y0 = ph;
  local_34 = pixel_height;
  iVar1 = stbtt_InitFont((stbtt_fontinfo *)local_c0,data,offset);
  if (iVar1 == 0) {
    x0 = -1;
  }
  else {
    local_48 = pw;
    memset(pixels,0,(long)(y0 * pw));
    local_34 = stbtt_ScaleForPixelHeight((stbtt_fontinfo *)local_c0,local_34);
    uVar2 = 0;
    uVar3 = (ulong)(uint)num_chars;
    if (num_chars < 1) {
      uVar3 = uVar2;
    }
    x0 = 1;
    iVar1 = 1;
    iVar5 = 1;
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      glyph_index = stbtt_FindGlyphIndex((stbtt_fontinfo *)local_c0,first_char + (int)uVar2);
      stbtt_GetGlyphHMetrics((stbtt_fontinfo *)local_c0,glyph_index,&local_5c,&f.indexToLocFormat);
      stbtt_GetGlyphBitmapBox
                ((stbtt_fontinfo *)local_c0,glyph_index,local_34,local_34,&local_44,&local_40,
                 &local_58,&advance);
      out_w = local_58 - local_44;
      out_h = advance - local_40;
      if (local_48 <= iVar5 + out_w + 1) {
        iVar5 = 1;
        iVar1 = x0;
      }
      x1 = iVar1 + out_h + 1;
      if (y0 <= x1) {
        return -(int)uVar2;
      }
      iVar4 = iVar5 + out_w;
      if (local_48 <= iVar4) {
        __assert_fail("x+gw < pw",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                      ,0xa04,
                      "int stbtt_BakeFontBitmap(const unsigned char *, int, float, unsigned char *, int, int, int, int, stbtt_bakedchar *)"
                     );
      }
      y1 = iVar1 + out_h;
      stbtt_MakeGlyphBitmap
                ((stbtt_fontinfo *)local_c0,pixels + (long)(iVar1 * local_48) + (long)iVar5,out_w,
                 out_h,local_48,local_34,local_34,glyph_index);
      chardata->x0 = (unsigned_short)iVar5;
      chardata->y0 = (unsigned_short)iVar1;
      chardata->x1 = (unsigned_short)iVar4;
      chardata->y1 = (unsigned_short)y1;
      chardata->xadvance = (float)local_5c * local_34;
      chardata->xoff = (float)local_44;
      iVar5 = iVar4 + 1;
      if (x0 <= y1) {
        x0 = x1;
      }
      chardata->yoff = (float)local_40;
      chardata = chardata + 1;
    }
  }
  return x0;
}

Assistant:

STBTT_DEF int stbtt_BakeFontBitmap(const unsigned char *data, int offset,  // font location (use offset=0 for plain .ttf)
                                float pixel_height,                     // height of font in pixels
                                unsigned char *pixels, int pw, int ph,  // bitmap to be filled in
                                int first_char, int num_chars,          // characters to bake
                                stbtt_bakedchar *chardata)
{
   float scale;
   int x,y,bottom_y, i;
   stbtt_fontinfo f;
   f.userdata = NULL;
   if (!stbtt_InitFont(&f, data, offset))
      return -1;
   STBTT_memset(pixels, 0, pw*ph); // background of 0 around pixels
   x=y=1;
   bottom_y = 1;

   scale = stbtt_ScaleForPixelHeight(&f, pixel_height);

   for (i=0; i < num_chars; ++i) {
      int advance, lsb, x0,y0,x1,y1,gw,gh;
      int g = stbtt_FindGlyphIndex(&f, first_char + i);
      stbtt_GetGlyphHMetrics(&f, g, &advance, &lsb);
      stbtt_GetGlyphBitmapBox(&f, g, scale,scale, &x0,&y0,&x1,&y1);
      gw = x1-x0;
      gh = y1-y0;
      if (x + gw + 1 >= pw)
         y = bottom_y, x = 1; // advance to next row
      if (y + gh + 1 >= ph) // check if it fits vertically AFTER potentially moving to next row
         return -i;
      STBTT_assert(x+gw < pw);
      STBTT_assert(y+gh < ph);
      stbtt_MakeGlyphBitmap(&f, pixels+x+y*pw, gw,gh,pw, scale,scale, g);
      chardata[i].x0 = (stbtt_int16) x;
      chardata[i].y0 = (stbtt_int16) y;
      chardata[i].x1 = (stbtt_int16) (x + gw);
      chardata[i].y1 = (stbtt_int16) (y + gh);
      chardata[i].xadvance = scale * advance;
      chardata[i].xoff     = (float) x0;
      chardata[i].yoff     = (float) y0;
      x = x + gw + 1;
      if (y+gh+1 > bottom_y)
         bottom_y = y+gh+1;
   }
   return bottom_y;
}